

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void anon_unknown.dwarf_5292d::parse_config_file(string *config_filename,string *program_name)

{
  bool bVar1;
  __type _Var2;
  undefined8 uVar3;
  istream *piVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ostream *poVar8;
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  string local_300 [8];
  string argval;
  string local_2e0 [8];
  string argname;
  size_t pos;
  String local_298 [32];
  string local_278 [8];
  string line;
  istream local_258 [8];
  ifstream in;
  allocator local_39;
  string local_38 [8];
  string section;
  string *program_name_local;
  string *config_filename_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"*",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = GEO::FileSystem::is_file(config_filename);
  if (bVar1) {
    uVar3 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_258,uVar3,8);
    std::__cxx11::string::string(local_278);
LAB_001a1c40:
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_278);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (bVar1) {
      uVar5 = std::__cxx11::string::length();
      if ((2 < uVar5) &&
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_278), *pcVar6 == '[')) {
        std::__cxx11::string::length();
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
        if (*pcVar6 == ']') {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)&pos,(ulong)local_278);
          GEO::String::to_uppercase(local_298,(string *)&pos);
          std::__cxx11::string::operator=(local_38,(string *)local_298);
          std::__cxx11::string::~string((string *)local_298);
          std::__cxx11::string::~string((string *)&pos);
          goto LAB_001a1c40;
        }
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,program_name);
      if (((_Var2) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_38,"*"), bVar1)) &&
         (lVar7 = std::__cxx11::string::find((char *)local_278,0x27b62e), lVar7 != -1)) {
        std::__cxx11::string::substr((ulong)local_2e0,(ulong)local_278);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_300,(ulong)local_278);
        bVar1 = GEO::CmdLine::arg_is_declared(local_2e0);
        if (bVar1) {
          GEO::CmdLine::set_arg(local_2e0,local_300);
        }
        else if (((anonymous_namespace)::auto_create_args & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_348,"config",&local_349);
          poVar8 = GEO::Logger::warn((string *)local_348);
          poVar8 = std::operator<<(poVar8,(string *)local_2e0);
          poVar8 = std::operator<<(poVar8,"=");
          poVar8 = std::operator<<(poVar8,(string *)local_300);
          poVar8 = std::operator<<(poVar8," ignored");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_348);
          std::allocator<char>::~allocator((allocator<char> *)&local_349);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_320,"...",&local_321);
          GEO::CmdLine::declare_arg(local_2e0,local_300,(string *)local_320,ARG_FLAGS_DEFAULT);
          std::__cxx11::string::~string(local_320);
          std::allocator<char>::~allocator((allocator<char> *)&local_321);
        }
        std::__cxx11::string::~string((string *)local_300);
        std::__cxx11::string::~string((string *)local_2e0);
      }
      goto LAB_001a1c40;
    }
    (anonymous_namespace)::loaded_config_file = 1;
    std::__cxx11::string::~string(local_278);
    std::ifstream::~ifstream(local_258);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void parse_config_file(
	const std::string& config_filename, const std::string& program_name
    ) {
	std::string section = "*";
	if(FileSystem::is_file(config_filename)) {
	    std::ifstream in(config_filename.c_str());
	    std::string line;
	    while(std::getline(in,line)) {
		if(line.length() >= 3 && line[0] == '[' && line[line.length()-1] == ']') {
		    section = String::to_uppercase(line.substr(1,line.length()-2));
		} else if(section == program_name || section == "*") {
		    size_t pos = line.find("=");
		    if(pos != std::string::npos) {
			std::string argname = line.substr(0,pos);
			std::string argval  = line.substr(pos+1,line.length()-pos-1);
			if(CmdLine::arg_is_declared(argname)) {
			    CmdLine::set_arg(argname, argval);
			} else {
			    if(auto_create_args) {
				CmdLine::declare_arg(argname, argval, "...");
			    } else {
				Logger::warn("config") << argname
						       << "=" << argval
						       << " ignored"
						       << std::endl;
			    }
			}
		    }
		}
	    }
	    loaded_config_file= true;
	}
    }